

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O0

void __thiscall Clasp::Cli::ClaspAppBase::run(ClaspAppBase *this,ClaspFacade *clasp)

{
  bool bVar1;
  ulong uVar2;
  ClaspAppBase *pCVar3;
  size_t in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  ClaspAppBase *in_RSI;
  EventHandler *in_RDI;
  ClaspFacade *in_stack_00000028;
  ClaspAppBase *in_stack_00000030;
  ProgramBuilder *in_stack_00000220;
  ClaspAppBase *in_stack_00000228;
  ClaspFacade *in_stack_ffffffffffffff98;
  ClaspAppBase *in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb6;
  ClaspFacade *this_00;
  undefined2 in_stack_ffffffffffffffd0;
  Result in_stack_ffffffffffffffd2;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  EnumMode in_stack_ffffffffffffffdc;
  ClaspFacade *in_stack_ffffffffffffffe0;
  
  this_00 = (ClaspFacade *)&in_RDI[3].verb_;
  pCVar3 = in_RSI;
  getStream((ClaspAppBase *)this_00,SUB81((ulong)in_RSI >> 0x38,0));
  ClaspFacade::start(this_00,(ClaspConfig *)pCVar3,
                     (istream *)CONCAT26(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0));
  pCVar3 = in_RSI;
  handleStartOptions(in_stack_00000030,in_stack_00000028);
  __buf = extraout_RDX;
  while (uVar2 = ClaspFacade::read((ClaspFacade *)in_RSI,(int)pCVar3,__buf,in_RCX), (uVar2 & 1) != 0
        ) {
    pCVar3 = (ClaspAppBase *)ClaspFacade::program((ClaspFacade *)0x119743);
    bVar1 = handlePostGroundOptions(in_stack_00000228,in_stack_00000220);
    __buf = extraout_RDX_00;
    if (bVar1) {
      ClaspFacade::prepare(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
      pCVar3 = in_RSI;
      bVar1 = handlePreSolveOptions(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      __buf = extraout_RDX_01;
      if (bVar1) {
        pCVar3 = (ClaspAppBase *)&stack0xffffffffffffffe0;
        in_stack_ffffffffffffffa0 = in_RSI;
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pod_vector
                  ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)this_00);
        in_stack_ffffffffffffffd2 =
             ClaspFacade::solve((ClaspFacade *)
                                CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                                (LitVec *)
                                CONCAT44(in_stack_ffffffffffffffd4,
                                         CONCAT22(in_stack_ffffffffffffffd2,
                                                  in_stack_ffffffffffffffd0)),in_RDI);
        bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::~pod_vector
                  ((pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *)0x1197c1);
        __buf = extraout_RDX_02;
      }
    }
  }
  return;
}

Assistant:

void ClaspAppBase::run(ClaspFacade& clasp) {
	clasp.start(claspConfig_, getStream());
	handleStartOptions(clasp);
	while (clasp.read()) {
		if (handlePostGroundOptions(*clasp.program())) {
			clasp.prepare();
			if (handlePreSolveOptions(clasp)) { clasp.solve(); }
		}
	}
}